

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O1

DdNode * cuddBddSqueeze(DdManager *dd,DdNode *l,DdNode *u)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  DdNode *g;
  int iVar4;
  DdNode *pDVar5;
  uint *puVar6;
  DdNode *pDVar7;
  DdNode *u_00;
  ulong uVar8;
  DdNode *l_00;
  uint index;
  DdNode *g_00;
  DdNode *pDVar9;
  DdNode *f;
  DdNode *local_58;
  DdNode *local_50;
  
  if (l == u) {
    return l;
  }
  pDVar7 = dd->one;
  pDVar9 = (DdNode *)((ulong)pDVar7 ^ 1);
  if (pDVar9 == l) {
    return l;
  }
  if (pDVar7 == u) {
    return u;
  }
  uVar8 = (ulong)u & 1;
  f = (DdNode *)((ulong)u & 0xfffffffffffffffe);
  g = (DdNode *)((ulong)l ^ 1);
  if (uVar8 == 0) {
    f = l;
    g = u;
  }
  pDVar5 = cuddCacheLookup2(dd,Cudd_bddSqueeze,f,g);
  if (pDVar5 != (DdNode *)0x0) {
LAB_0077fc0e:
    return (DdNode *)(uVar8 ^ (ulong)pDVar5);
  }
  uVar2 = dd->perm[g->index];
  puVar6 = (uint *)((ulong)f & 0xfffffffffffffffe);
  uVar3 = dd->perm[*puVar6];
  local_58 = g;
  local_50 = g;
  index = *puVar6;
  if (uVar2 <= uVar3) {
    local_58 = (g->type).kids.T;
    local_50 = (g->type).kids.E;
    index = g->index;
  }
  pDVar5 = f;
  g_00 = f;
  if (uVar3 <= uVar2) {
    pDVar5 = *(DdNode **)(puVar6 + 4);
    g_00 = *(DdNode **)(puVar6 + 6);
    if (((ulong)f & 1) != 0) {
      pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
      g_00 = (DdNode *)((ulong)g_00 ^ 1);
    }
  }
  if ((((pDVar5 == pDVar9) || (iVar4 = Cudd_bddLeq(dd,pDVar5,g_00), iVar4 != 0)) &&
      ((u_00 = local_50, l_00 = g_00, local_58 == pDVar7 ||
       (iVar4 = Cudd_bddLeq(dd,local_50,local_58), iVar4 != 0)))) ||
     (((g_00 == pDVar9 || (iVar4 = Cudd_bddLeq(dd,g_00,pDVar5), iVar4 != 0)) &&
      ((u_00 = local_58, l_00 = pDVar5, local_50 == pDVar7 ||
       (iVar4 = Cudd_bddLeq(dd,local_58,local_50), iVar4 != 0)))))) {
    pDVar5 = cuddBddSqueeze(dd,l_00,u_00);
    if (pDVar5 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    goto LAB_0077fc0e;
  }
  if (((g_00 == pDVar9) ||
      (iVar4 = Cudd_bddLeq(dd,g_00,(DdNode *)((ulong)local_58 ^ 1)), iVar4 != 0)) &&
     ((local_50 == pDVar7 ||
      (iVar4 = Cudd_bddLeq(dd,(DdNode *)((ulong)pDVar5 ^ 1),local_50), iVar4 != 0)))) {
    pDVar7 = cuddBddSqueeze(dd,pDVar5,local_58);
    pDVar9 = (DdNode *)((ulong)pDVar7 & 0xfffffffffffffffe);
    pDVar9->ref = pDVar9->ref + 1;
    pDVar5 = pDVar9;
    local_58 = pDVar7;
    if (((ulong)pDVar7 & 1) == 0) {
      pDVar9 = (DdNode *)((ulong)pDVar7 | 1);
LAB_0077fddd:
      pDVar7 = cuddUniqueInter(dd,index,pDVar7,pDVar9);
      if (pDVar7 == (DdNode *)0x0) goto LAB_0077fe1a;
    }
    else {
LAB_0077fd3a:
      pDVar7 = cuddUniqueInter(dd,index,pDVar9,pDVar7);
      if (pDVar7 == (DdNode *)0x0) goto LAB_0077fe1a;
      pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
    }
    pDVar5->ref = pDVar5->ref - 1;
    if (pDVar7 != (DdNode *)0x0) {
      cuddCacheInsert2(dd,Cudd_bddSqueeze,f,g,pDVar7);
      return (DdNode *)(uVar8 ^ (ulong)pDVar7);
    }
  }
  else {
    if (((pDVar5 == pDVar9) ||
        (iVar4 = Cudd_bddLeq(dd,pDVar5,(DdNode *)((ulong)local_50 ^ 1)), iVar4 != 0)) &&
       ((local_58 == pDVar7 ||
        (iVar4 = Cudd_bddLeq(dd,(DdNode *)((ulong)g_00 ^ 1),local_58), iVar4 != 0)))) {
      pDVar9 = cuddBddSqueeze(dd,g_00,local_50);
      pDVar7 = (DdNode *)((ulong)pDVar9 & 0xfffffffffffffffe);
      pDVar7->ref = pDVar7->ref + 1;
      pDVar5 = pDVar7;
      local_58 = pDVar9;
      if (((ulong)pDVar9 & 1) != 0) goto LAB_0077fddd;
      pDVar7 = (DdNode *)((ulong)pDVar9 | 1);
      goto LAB_0077fd3a;
    }
    local_58 = cuddBddSqueeze(dd,pDVar5,local_58);
    if (local_58 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar7 = (DdNode *)((ulong)local_58 & 0xfffffffffffffffe);
    pDVar7->ref = pDVar7->ref + 1;
    pDVar9 = cuddBddSqueeze(dd,g_00,local_50);
    if (pDVar9 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      if (((ulong)local_58 & 1) == 0) {
        pDVar5 = local_58;
        if (local_58 != pDVar9) {
          pDVar5 = cuddUniqueInter(dd,index,local_58,pDVar9);
        }
        pDVar7 = local_58;
        if (pDVar5 != (DdNode *)0x0) {
LAB_0077fe52:
          piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert2(dd,Cudd_bddSqueeze,f,g,pDVar5);
          return (DdNode *)(uVar8 ^ (ulong)pDVar5);
        }
      }
      else {
        pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
        pDVar5 = pDVar7;
        if (pDVar7 != pDVar9) {
          pDVar5 = cuddUniqueInter(dd,index,pDVar7,pDVar9);
        }
        local_58 = pDVar7;
        if (pDVar5 != (DdNode *)0x0) {
          pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
          goto LAB_0077fe52;
        }
      }
      Cudd_IterDerefBdd(dd,pDVar9);
    }
LAB_0077fe1a:
    Cudd_IterDerefBdd(dd,local_58);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
cuddBddSqueeze(
  DdManager * dd,
  DdNode * l,
  DdNode * u)
{
    DdNode *one, *zero, *r, *lt, *le, *ut, *ue, *t, *e;
#if 0
    DdNode *ar;
#endif
    int comple = 0;
    unsigned int topu, topl;
    int index;

    statLine(dd);
    if (l == u) {
        return(l);
    }
    one = DD_ONE(dd);
    zero = Cudd_Not(one);
    /* The only case when l == zero && u == one is at the top level,
    ** where returning either one or zero is OK. In all other cases
    ** the procedure will detect such a case and will perform
    ** remapping. Therefore the order in which we test l and u at this
    ** point is immaterial. */
    if (l == zero) return(l);
    if (u == one)  return(u);

    /* Make canonical to increase the utilization of the cache. */
    if (Cudd_IsComplement(u)) {
        DdNode *temp;
        temp = Cudd_Not(l);
        l = Cudd_Not(u);
        u = temp;
        comple = 1;
    }
    /* At this point u is regular and non-constant; l is non-constant, but
    ** may be complemented. */

    /* Here we could check the relative sizes. */

    /* Check the cache. */
    r = cuddCacheLookup2(dd, Cudd_bddSqueeze, l, u);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    /* Recursive step. */
    topu = dd->perm[u->index];
    topl = dd->perm[Cudd_Regular(l)->index];
    if (topu <= topl) {
        index = u->index;
        ut = cuddT(u); ue = cuddE(u);
    } else {
        index = Cudd_Regular(l)->index;
        ut = ue = u;
    }
    if (topl <= topu) {
        lt = cuddT(Cudd_Regular(l)); le = cuddE(Cudd_Regular(l));
        if (Cudd_IsComplement(l)) {
            lt = Cudd_Not(lt);
            le = Cudd_Not(le);
        }
    } else {
        lt = le = l;
    }

    /* If one interval is contained in the other, use the smaller
    ** interval. This corresponds to one-sided matching. */
    if ((lt == zero || Cudd_bddLeq(dd,lt,le)) &&
        (ut == one  || Cudd_bddLeq(dd,ue,ut))) { /* remap */
        r = cuddBddSqueeze(dd, le, ue);
        if (r == NULL)
            return(NULL);
        return(Cudd_NotCond(r,comple));
    } else if ((le == zero || Cudd_bddLeq(dd,le,lt)) &&
               (ue == one  || Cudd_bddLeq(dd,ut,ue))) { /* remap */
        r = cuddBddSqueeze(dd, lt, ut);
        if (r == NULL)
            return(NULL);
        return(Cudd_NotCond(r,comple));
    } else if ((le == zero || Cudd_bddLeq(dd,le,Cudd_Not(ut))) &&
               (ue == one  || Cudd_bddLeq(dd,Cudd_Not(lt),ue))) { /* c-remap */
        t = cuddBddSqueeze(dd, lt, ut);
        cuddRef(t);
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(dd, index, Cudd_Not(t), t);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(dd, index, t, Cudd_Not(t));
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
        }
        cuddDeref(t);
        if (r == NULL)
            return(NULL);
        cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
        return(Cudd_NotCond(r,comple));
    } else if ((lt == zero || Cudd_bddLeq(dd,lt,Cudd_Not(ue))) &&
               (ut == one  || Cudd_bddLeq(dd,Cudd_Not(le),ut))) { /* c-remap */
        e = cuddBddSqueeze(dd, le, ue);
        cuddRef(e);
        if (Cudd_IsComplement(e)) {
            r = cuddUniqueInter(dd, index, Cudd_Not(e), e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                return(NULL);
            }
        } else {
            r = cuddUniqueInter(dd, index, e, Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        }
        cuddDeref(e);
        if (r == NULL)
            return(NULL);
        cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
        return(Cudd_NotCond(r,comple));
    }

#if 0
    /* If the two intervals intersect, take a solution from
    ** the intersection of the intervals. This guarantees that the
    ** splitting variable will not appear in the result.
    ** This approach corresponds to two-sided matching, and is very
    ** expensive. */
    if (Cudd_bddLeq(dd,lt,ue) && Cudd_bddLeq(dd,le,ut)) {
        DdNode *au, *al;
        au = cuddBddAndRecur(dd,ut,ue);
        if (au == NULL)
            return(NULL);
        cuddRef(au);
        al = cuddBddAndRecur(dd,Cudd_Not(lt),Cudd_Not(le));
        if (al == NULL) {
            Cudd_IterDerefBdd(dd,au);
            return(NULL);
        }
        cuddRef(al);
        al = Cudd_Not(al);
        ar = cuddBddSqueeze(dd, al, au);
        if (ar == NULL) {
            Cudd_IterDerefBdd(dd,au);
            Cudd_IterDerefBdd(dd,al);
            return(NULL);
        }
        cuddRef(ar);
        Cudd_IterDerefBdd(dd,au);
        Cudd_IterDerefBdd(dd,al);
    } else {
        ar = NULL;
    }
#endif

    t = cuddBddSqueeze(dd, lt, ut);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);
    e = cuddBddSqueeze(dd, le, ue);
    if (e == NULL) {
        Cudd_IterDerefBdd(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
        if (r == NULL) {
            Cudd_IterDerefBdd(dd, e);
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
        if (r == NULL) {
            Cudd_IterDerefBdd(dd, e);
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

#if 0
    /* Check whether there is a result obtained by abstraction and whether
    ** it is better than the one obtained by recursion. */
    cuddRef(r);
    if (ar != NULL) {
        if (Cudd_DagSize(ar) <= Cudd_DagSize(r)) {
            Cudd_IterDerefBdd(dd, r);
            r = ar;
        } else {
            Cudd_IterDerefBdd(dd, ar);
        }
    }
    cuddDeref(r);
#endif

    cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
    return(Cudd_NotCond(r,comple));

}